

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  ushort uVar1;
  int iVar2;
  int nByte;
  int fg;
  u8 bForce_local;
  u8 enc_local;
  Mem *pMem_local;
  
  uVar1 = pMem->flags;
  iVar2 = sqlite3VdbeMemClearAndResize(pMem,0x20);
  if (iVar2 == 0) {
    if ((uVar1 & 4) == 0) {
      sqlite3_snprintf(0x20,pMem->z,"%!.15g",(pMem->u).r);
    }
    else {
      sqlite3_snprintf(0x20,pMem->z,"%lld",(pMem->u).r);
    }
    iVar2 = sqlite3Strlen30(pMem->z);
    pMem->n = iVar2;
    pMem->enc = '\x01';
    pMem->flags = pMem->flags | 0x202;
    if (bForce != '\0') {
      pMem->flags = pMem->flags & 0xfff3;
    }
    sqlite3VdbeChangeEncoding(pMem,(uint)enc);
    pMem_local._4_4_ = 0;
  }
  else {
    pMem->enc = '\0';
    pMem_local._4_4_ = 7;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  int fg = pMem->flags;
  const int nByte = 32;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(fg&MEM_Zero) );
  assert( !(fg&(MEM_Str|MEM_Blob)) );
  assert( fg&(MEM_Int|MEM_Real) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  /* For a Real or Integer, use sqlite3_snprintf() to produce the UTF-8
  ** string representation of the value. Then, if the required encoding
  ** is UTF-16le or UTF-16be do a translation.
  ** 
  ** FIX ME: It would be better if sqlite3_snprintf() could do UTF-16.
  */
  if( fg & MEM_Int ){
    sqlite3_snprintf(nByte, pMem->z, "%lld", pMem->u.i);
  }else{
    assert( fg & MEM_Real );
    sqlite3_snprintf(nByte, pMem->z, "%!.15g", pMem->u.r);
  }
  pMem->n = sqlite3Strlen30(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}